

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_7z.cpp
# Opt level: O1

SRes __thiscall C7zArchive::Extract(C7zArchive *this,UInt32 file_index,char *buffer)

{
  SRes SVar1;
  size_t out_size_processed;
  size_t offset;
  
  SVar1 = SzArEx_Extract(&this->DB,&(this->LookStream).s,file_index,&this->BlockIndex,
                         &this->OutBuffer,&this->OutBufferSize,&offset,&out_size_processed,&g_Alloc,
                         &g_Alloc);
  if (SVar1 == 0) {
    memcpy(buffer,this->OutBuffer + offset,out_size_processed);
  }
  return SVar1;
}

Assistant:

SRes Extract(UInt32 file_index, char *buffer)
	{
		size_t offset, out_size_processed;
		SRes res = SzArEx_Extract(&DB, &LookStream.s, file_index,
			&BlockIndex, &OutBuffer, &OutBufferSize,
			&offset, &out_size_processed,
			&g_Alloc, &g_Alloc);
		if (res == SZ_OK)
		{
			memcpy(buffer, OutBuffer + offset, out_size_processed);
		}
		return res;
	}